

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

xmlChar * xmlLoadFileContent(char *filename)

{
  int iVar1;
  xmlChar *__buf;
  ssize_t sVar2;
  stat info;
  stat64 sStack_a8;
  
  if ((filename != (char *)0x0) && (iVar1 = stat64(filename,&sStack_a8), -1 < iVar1)) {
    iVar1 = open64(filename,0);
    if (iVar1 < 0) {
      return (xmlChar *)0x0;
    }
    __buf = (xmlChar *)(*xmlMallocAtomic)(sStack_a8.st_size + 10);
    if (__buf == (xmlChar *)0x0) {
      xmlCatalogErrMemory("allocating catalog data");
      close(iVar1);
    }
    else {
      sVar2 = read(iVar1,__buf,sStack_a8.st_size);
      close(iVar1);
      if (-1 < (int)(uint)sVar2) {
        __buf[(uint)sVar2 & 0x7fffffff] = '\0';
        return __buf;
      }
      (*xmlFree)(__buf);
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlLoadFileContent(const char *filename)
{
#ifdef HAVE_STAT
    int fd;
#else
    FILE *fd;
#endif
    int len;
    long size;

#ifdef HAVE_STAT
    struct stat info;
#endif
    xmlChar *content;

    if (filename == NULL)
        return (NULL);

#ifdef HAVE_STAT
    if (stat(filename, &info) < 0)
        return (NULL);
#endif

#ifdef HAVE_STAT
    if ((fd = open(filename, O_RDONLY)) < 0)
#else
    if ((fd = fopen(filename, "rb")) == NULL)
#endif
    {
        return (NULL);
    }
#ifdef HAVE_STAT
    size = info.st_size;
#else
    if (fseek(fd, 0, SEEK_END) || (size = ftell(fd)) == EOF || fseek(fd, 0, SEEK_SET)) {        /* File operations denied? ok, just close and return failure */
        fclose(fd);
        return (NULL);
    }
#endif
    content = (xmlChar*)xmlMallocAtomic(size + 10);
    if (content == NULL) {
        xmlCatalogErrMemory("allocating catalog data");
#ifdef HAVE_STAT
	close(fd);
#else
	fclose(fd);
#endif
        return (NULL);
    }
#ifdef HAVE_STAT
    len = read(fd, content, size);
    close(fd);
#else
    len = fread(content, 1, size, fd);
    fclose(fd);
#endif
    if (len < 0) {
        xmlFree(content);
        return (NULL);
    }
    content[len] = 0;

    return(content);
}